

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManComputeTruth_rec(If_DsdMan_t *p,int iDsd,word *pRes,uchar *pPermLits,int *pnSupp)

{
  int *piVar1;
  Vec_Mem_t *pVVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  word *pwVar8;
  ulong uVar9;
  ulong uVar10;
  word pTtTemp [64];
  word local_1838 [64];
  ulong auStack_1638 [64];
  ulong auStack_1438 [641];
  
  if (iDsd < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  if ((p->vObjs).nSize <= (int)((uint)iDsd >> 1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar1 = (int *)(p->vObjs).pArray[(uint)iDsd >> 1];
  switch(piVar1[1] & 7) {
  case 2:
    iVar6 = *pnSupp;
    if (pPermLits == (uchar *)0x0) {
      if (iVar6 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar5 = iVar6 * 2;
    }
    else {
      uVar5 = (uint)pPermLits[iVar6];
    }
    iVar6 = *pnSupp;
    *pnSupp = iVar6 + 1;
    if (p->nVars <= iVar6) {
      __assert_fail("(*pnSupp) <= p->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x555,
                    "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                   );
    }
    pwVar8 = p->pTtElems[uVar5 >> 1];
    uVar7 = p->nWords;
    if (((iDsd ^ uVar5) & 1) == 0) {
      if (0 < (int)uVar7) {
        uVar10 = 0;
        do {
          pRes[uVar10] = pwVar8[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
    }
    else if (0 < (int)uVar7) {
      uVar10 = 0;
      do {
        pRes[uVar10] = ~pwVar8[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
    break;
  case 3:
  case 4:
    uVar5 = p->nWords;
    if ((piVar1[1] & 7U) == 3) {
      if (0 < (int)uVar5) {
        iVar6 = 0xff;
LAB_004297ba:
        memset(pRes,iVar6,(ulong)uVar5 << 3);
      }
    }
    else if (0 < (int)uVar5) {
      iVar6 = 0;
      goto LAB_004297ba;
    }
    if (0x7ffffff < (uint)piVar1[1]) {
      uVar10 = 0;
      do {
        if (piVar1[uVar10 + 2] == 0) break;
        If_DsdManComputeTruth_rec(p,piVar1[uVar10 + 2],local_1838,pPermLits,pnSupp);
        if ((piVar1[1] & 7U) == 3) {
          iVar6 = p->nWords;
          if (0 < (long)iVar6) {
            lVar3 = 0;
            do {
              pRes[lVar3] = pRes[lVar3] & local_1838[lVar3];
              lVar3 = lVar3 + 1;
            } while (iVar6 != lVar3);
          }
        }
        else {
          iVar6 = p->nWords;
          if (0 < (long)iVar6) {
            lVar3 = 0;
            do {
              pRes[lVar3] = pRes[lVar3] ^ local_1838[lVar3];
              lVar3 = lVar3 + 1;
            } while (iVar6 != lVar3);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (uint)piVar1[1] >> 0x1b);
    }
    if (((iDsd & 1U) != 0) && (iVar6 = p->nWords, 0 < (long)iVar6)) {
      lVar3 = 0;
      do {
        pRes[lVar3] = ~pRes[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar6 != lVar3);
    }
    break;
  case 5:
    if (0x7ffffff < (uint)piVar1[1]) {
      pwVar8 = local_1838;
      uVar10 = 0;
      do {
        if (piVar1[uVar10 + 2] == 0) break;
        If_DsdManComputeTruth_rec(p,piVar1[uVar10 + 2],pwVar8,pPermLits,pnSupp);
        uVar10 = uVar10 + 1;
        pwVar8 = pwVar8 + 0x40;
      } while (uVar10 < (uint)piVar1[1] >> 0x1b);
      if ((int)uVar10 == 3) {
        iVar6 = p->nWords;
        lVar3 = (long)iVar6;
        if (0 < lVar3) {
          lVar4 = 0;
          do {
            pRes[lVar4] = (auStack_1638[lVar4] ^ auStack_1438[lVar4]) & local_1838[lVar4] ^
                          auStack_1438[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar3 != lVar4);
        }
        if ((iDsd & 1U) == 0 || iVar6 < 1) {
          return;
        }
        lVar4 = 0;
        do {
          pRes[lVar4] = ~pRes[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
        return;
      }
    }
    __assert_fail("i == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x570,
                  "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                 );
  case 6:
    uVar5 = piVar1[1];
    uVar10 = (ulong)(uVar5 >> 0x1b);
    if ((0x7ffffff < uVar5) && (iVar6 = piVar1[2], iVar6 != 0)) {
      uVar9 = 1;
      pwVar8 = local_1838;
      do {
        If_DsdManComputeTruth_rec(p,iVar6,pwVar8,pPermLits,pnSupp);
        uVar5 = piVar1[1];
        uVar10 = (ulong)(uVar5 >> 0x1b);
        if (uVar10 <= uVar9) break;
        iVar6 = piVar1[uVar9 + 2];
        uVar9 = uVar9 + 1;
        pwVar8 = pwVar8 + 0x40;
      } while (iVar6 != 0);
    }
    pVVar2 = p->vTtMem[uVar10];
    uVar7 = 0xffffffff;
    if (0x17ffffff < uVar5 && (uVar5 & 7) == 6) {
      iVar6 = *piVar1;
      if (((long)iVar6 < 0) || ((p->vTruths).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = (p->vTruths).pArray[iVar6];
    }
    if (((int)uVar7 < 0) || (pVVar2->nEntries <= (int)uVar7)) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    Dau_DsdTruthCompose_rec
              (pVVar2->ppPages[uVar7 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
               (long)(int)(uVar7 & pVVar2->PageMask) * (long)pVVar2->nEntrySize,&local_1838,pRes,
               (int)uVar10,p->nWords);
    if (((iDsd & 1U) != 0) && (iVar6 = p->nWords, 0 < (long)iVar6)) {
      lVar3 = 0;
      do {
        pRes[lVar3] = ~pRes[lVar3];
        lVar3 = lVar3 + 1;
      } while (iVar6 != lVar3);
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x57e,
                  "void If_DsdManComputeTruth_rec(If_DsdMan_t *, int, word *, unsigned char *, int *)"
                 );
  }
  return;
}

Assistant:

void If_DsdManComputeTruth_rec( If_DsdMan_t * p, int iDsd, word * pRes, unsigned char * pPermLits, int * pnSupp )
{
    int i, iFanin, fCompl = Abc_LitIsCompl(iDsd);
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsd) );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[*pnSupp] : Abc_Var2Lit(*pnSupp, 0);
        (*pnSupp)++;
        assert( (*pnSupp) <= p->nVars );
        Abc_TtCopy( pRes, p->pTtElems[Abc_Lit2Var(iPermLit)], p->nWords, fCompl ^ Abc_LitIsCompl(iPermLit) );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR )
    {
        word pTtTemp[DAU_MAX_WORD];
        if ( If_DsdObjType(pObj) == IF_DSD_AND )
            Abc_TtConst1( pRes, p->nWords );
        else
            Abc_TtConst0( pRes, p->nWords );
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            If_DsdManComputeTruth_rec( p, iFanin, pTtTemp, pPermLits, pnSupp );
            if ( If_DsdObjType(pObj) == IF_DSD_AND )
                Abc_TtAnd( pRes, pRes, pTtTemp, p->nWords, 0 );
            else
                Abc_TtXor( pRes, pRes, pTtTemp, p->nWords, 0 );
        }
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX ) // mux
    {
        word pTtTemp[3][DAU_MAX_WORD];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            If_DsdManComputeTruth_rec( p, iFanin, pTtTemp[i], pPermLits, pnSupp );
        assert( i == 3 );
        Abc_TtMux( pRes, pTtTemp[0], pTtTemp[1], pTtTemp[2], p->nWords );
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME ) // function
    {
        word pFanins[DAU_MAX_VAR][DAU_MAX_WORD];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            If_DsdManComputeTruth_rec( p, iFanin, pFanins[i], pPermLits, pnSupp );
        Dau_DsdTruthCompose_rec( If_DsdObjTruth(p, pObj), pFanins, pRes, pObj->nFans, p->nWords );
        if ( fCompl ) Abc_TtNot( pRes, p->nWords );
        return;
    }
    assert( 0 );

}